

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_freeCDict(ZSTD_CDict *cdict)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  int iVar1;
  int cdictInWorkspace;
  ZSTD_customMem cMem;
  ZSTD_CDict *cdict_local;
  
  if (cdict != (ZSTD_CDict *)0x0) {
    customMem_00 = cdict->customMem;
    customMem = cdict->customMem;
    iVar1 = ZSTD_cwksp_owns_buffer(&cdict->workspace,cdict);
    ZSTD_cwksp_free(&cdict->workspace,customMem);
    if (iVar1 == 0) {
      ZSTD_customFree(cdict,customMem_00);
    }
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCDict(ZSTD_CDict* cdict)
{
    if (cdict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = cdict->customMem;
        int cdictInWorkspace = ZSTD_cwksp_owns_buffer(&cdict->workspace, cdict);
        ZSTD_cwksp_free(&cdict->workspace, cMem);
        if (!cdictInWorkspace) {
            ZSTD_customFree(cdict, cMem);
        }
        return 0;
    }
}